

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalEndWriteTransaction(Wal *pWal)

{
  long in_RDI;
  
  if (*(char *)(in_RDI + 0x40) != '\0') {
    walUnlockExclusive(pWal,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    *(undefined1 *)(in_RDI + 0x40) = 0;
    *(undefined4 *)(in_RDI + 0x7c) = 0;
    *(undefined1 *)(in_RDI + 0x43) = 0;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalEndWriteTransaction(Wal *pWal){
  if( pWal->writeLock ){
    walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    pWal->writeLock = 0;
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = 0;
  }
  return SQLITE_OK;
}